

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgDisplay * __thiscall
cimg_library::CImgDisplay::set_button(CImgDisplay *this,uint button,bool is_pressed)

{
  uint uVar1;
  int iVar2;
  undefined7 in_register_00000011;
  
  uVar1 = (uint)(button == 3) << 2;
  if (button - 1 < 2) {
    uVar1 = button;
  }
  if ((int)CONCAT71(in_register_00000011,is_pressed) == 0) {
    this->_button = this->_button & ~uVar1;
  }
  else {
    this->_button = this->_button | uVar1;
  }
  this->_is_event = uVar1 != 0;
  if (uVar1 != 0) {
    if (cimg::X11_attr()::val == '\0') {
      iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val);
      if (iVar2 != 0) {
        cimg::X11_static::X11_static(&cimg::X11_attr::val);
        __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
        __cxa_guard_release(&cimg::X11_attr()::val);
      }
    }
    pthread_cond_broadcast((pthread_cond_t *)&cimg::X11_attr::val.wait_event);
  }
  return this;
}

Assistant:

CImgDisplay& set_button(const unsigned int button, const bool is_pressed=true) {
      const unsigned int buttoncode = button==1U?1U:button==2U?2U:button==3U?4U:0U;
      if (is_pressed) _button |= buttoncode; else _button &= ~buttoncode;
      _is_event = buttoncode?true:false;
      if (buttoncode) {
#if cimg_display==1
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
#elif cimg_display==2
        SetEvent(cimg::Win32_attr().wait_event);
#endif
      }
      return *this;
    }